

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

void __thiscall duckdb::LoadInfo::Serialize(LoadInfo *this,Serializer *serializer)

{
  ParseInfo::Serialize(&this->super_ParseInfo,serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,200,"filename",&this->filename);
  Serializer::WriteProperty<duckdb::LoadType>(serializer,0xc9,"load_type",&this->load_type);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xca,"repository",&this->repository);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xcb,"version",&this->version);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xcc,"repo_is_alias",&this->repo_is_alias);
  return;
}

Assistant:

void LoadInfo::Serialize(Serializer &serializer) const {
	ParseInfo::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "filename", filename);
	serializer.WriteProperty<LoadType>(201, "load_type", load_type);
	serializer.WritePropertyWithDefault<string>(202, "repository", repository);
	serializer.WritePropertyWithDefault<string>(203, "version", version);
	serializer.WritePropertyWithDefault<bool>(204, "repo_is_alias", repo_is_alias);
}